

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

int redisBufferWrite(redisContext *c,int *done)

{
  int iVar1;
  size_t sVar2;
  sds pcVar3;
  
  iVar1 = -1;
  if (c->err == 0) {
    sVar2 = sdslen(c->obuf);
    if (sVar2 != 0) {
      iVar1 = (*c->funcs->write)(c);
      if (iVar1 < 1) {
        if (iVar1 < 0) {
          return -1;
        }
      }
      else {
        pcVar3 = c->obuf;
        sVar2 = sdslen(pcVar3);
        if (iVar1 == (int)sVar2) {
          sdsfree(pcVar3);
          pcVar3 = sdsempty();
          c->obuf = pcVar3;
        }
        else {
          sdsrange(pcVar3,iVar1,-1);
        }
      }
    }
    iVar1 = 0;
    if (done != (int *)0x0) {
      sVar2 = sdslen(c->obuf);
      *done = (uint)(sVar2 == 0);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int redisBufferWrite(redisContext *c, int *done) {

    /* Return early when the context has seen an error. */
    if (c->err)
        return REDIS_ERR;

    if (sdslen(c->obuf) > 0) {
        int nwritten = c->funcs->write(c);
        if (nwritten < 0) {
            return REDIS_ERR;
        } else if (nwritten > 0) {
            if (nwritten == (signed)sdslen(c->obuf)) {
                sdsfree(c->obuf);
                c->obuf = sdsempty();
            } else {
                sdsrange(c->obuf,nwritten,-1);
            }
        }
    }
    if (done != NULL) *done = (sdslen(c->obuf) == 0);
    return REDIS_OK;
}